

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves_getter.cpp
# Opt level: O3

void GetAllCaptureMovements(Situation *situation,int *num_of_all_movements,Movement *all_movements)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  int *piVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  
  uVar4 = situation->current_player;
  lVar6 = (long)(int)uVar4;
  iVar7 = uVar4 * 0x10;
  iVar8 = *num_of_all_movements;
  uVar16 = (ulong)(iVar7 + 0x10);
  bVar1 = situation->current_pieces[uVar16];
  if (bVar1 != 0) {
    iVar12 = *(int *)((long)KING_CAN_GET[0][lVar6] + (ulong)((uint)bVar1 * 0x50));
    if (iVar12 != 0) {
      piVar11 = (int *)((long)KING_CAN_GET[0][lVar6] + (ulong)((uint)bVar1 * 0x50) + 4);
      do {
        bVar2 = situation->current_board[iVar12];
        if ((bVar2 != 0) && (uVar4 != ((bVar2 & 0x10) == 0))) {
          all_movements[iVar8].capture = bVar2;
          all_movements[iVar8].from = bVar1;
          all_movements[iVar8].to = (UINT8)iVar12;
          all_movements[iVar8].catc = '\0';
          all_movements[iVar8].movec = '\0';
          iVar8 = iVar8 + 1;
          *num_of_all_movements = iVar8;
        }
        iVar12 = *piVar11;
        piVar11 = piVar11 + 1;
      } while (iVar12 != 0);
    }
  }
  uVar9 = uVar16 | 1;
  do {
    bVar1 = situation->current_pieces[uVar9];
    if (bVar1 != 0) {
      iVar12 = *(int *)((long)ADVISOR_CAN_GET[0][lVar6] + (ulong)((uint)bVar1 * 0x50));
      if (iVar12 != 0) {
        piVar11 = (int *)((ulong)((uint)bVar1 * 0x50) + lVar6 * 0x28 + 0x2f4d54);
        do {
          bVar2 = situation->current_board[iVar12];
          if ((bVar2 != 0) && (uVar4 != ((bVar2 & 0x10) == 0))) {
            all_movements[iVar8].capture = bVar2;
            all_movements[iVar8].from = bVar1;
            all_movements[iVar8].to = (UINT8)iVar12;
            all_movements[iVar8].catc = '\0';
            all_movements[iVar8].movec = '\0';
            iVar8 = iVar8 + 1;
            *num_of_all_movements = iVar8;
          }
          iVar12 = *piVar11;
          piVar11 = piVar11 + 1;
        } while (iVar12 != 0);
      }
    }
    bVar5 = (long)uVar9 < (long)(iVar7 + 0x12);
    uVar9 = uVar9 + 1;
  } while (bVar5);
  uVar9 = uVar16 | 3;
  do {
    bVar1 = situation->current_pieces[uVar9];
    if (bVar1 != 0) {
      iVar12 = *(int *)((long)BISHOP_CAN_GET[0][lVar6] + (ulong)((uint)bVar1 * 0x50));
      if (iVar12 != 0) {
        lVar17 = (ulong)((uint)bVar1 * 0x50) + lVar6 * 0x28;
        do {
          bVar2 = situation->current_board[iVar12];
          if (((bVar2 != 0) && (uVar4 != ((bVar2 & 0x10) == 0))) &&
             (situation->current_board[*(int *)((long)BISHOP_EYE[0][0] + lVar17)] == '\0')) {
            all_movements[iVar8].capture = bVar2;
            all_movements[iVar8].from = bVar1;
            all_movements[iVar8].to = (UINT8)iVar12;
            all_movements[iVar8].catc = '\0';
            all_movements[iVar8].movec = '\0';
            iVar8 = iVar8 + 1;
            *num_of_all_movements = iVar8;
          }
          iVar12 = *(int *)((long)BISHOP_CAN_GET[0][0] + lVar17 + 4);
          lVar17 = lVar17 + 4;
        } while (iVar12 != 0);
      }
    }
    bVar5 = (long)uVar9 < (long)(iVar7 + 0x14);
    uVar9 = uVar9 + 1;
  } while (bVar5);
  uVar9 = uVar16 | 5;
  do {
    bVar1 = situation->current_pieces[uVar9];
    if (((ulong)bVar1 != 0) && (iVar12 = HORSE_CAN_GET[bVar1][0], iVar12 != 0)) {
      lVar17 = (ulong)bVar1 * 0x28;
      do {
        bVar2 = situation->current_board[iVar12];
        if (((bVar2 != 0) && (uVar4 != ((bVar2 & 0x10) == 0))) &&
           (situation->current_board[*(int *)((long)HORSE_LEG[0] + lVar17)] == '\0')) {
          all_movements[iVar8].capture = bVar2;
          all_movements[iVar8].from = bVar1;
          all_movements[iVar8].to = (UINT8)iVar12;
          all_movements[iVar8].catc = '\0';
          all_movements[iVar8].movec = '\0';
          iVar8 = iVar8 + 1;
          *num_of_all_movements = iVar8;
        }
        iVar12 = *(int *)((long)HORSE_CAN_GET[0] + lVar17 + 4);
        lVar17 = lVar17 + 4;
      } while (iVar12 != 0);
    }
    bVar5 = (long)uVar9 < (long)(iVar7 + 0x16);
    uVar9 = uVar9 + 1;
  } while (bVar5);
  uVar9 = uVar16 | 7;
  do {
    bVar1 = situation->current_pieces[uVar9];
    if (bVar1 != 0) {
      uVar13 = bVar1 & 0xf;
      uVar15 = (uint)(bVar1 >> 4);
      uVar3 = situation->bit_row[uVar15];
      lVar17 = 0;
      bVar5 = true;
      do {
        bVar10 = bVar5;
        bVar2 = *(byte *)(lVar17 + ((ulong)uVar13 - 3) * 0x1000 + 0x308d52 + (ulong)uVar3 * 8);
        if (uVar13 != bVar2) {
          uVar14 = (ulong)bVar2 | (ulong)(bVar1 & 0xfffffff0);
          bVar2 = situation->current_board[uVar14];
          if (uVar4 != (bVar2 != 0 && (bVar2 & 0x10) == 0)) {
            all_movements[iVar8].capture = bVar2;
            all_movements[iVar8].from = bVar1;
            all_movements[iVar8].to = (UINT8)uVar14;
            all_movements[iVar8].catc = '\0';
            all_movements[iVar8].movec = '\0';
            iVar8 = iVar8 + 1;
            *num_of_all_movements = iVar8;
          }
        }
        lVar17 = 1;
        bVar5 = false;
      } while (bVar10);
      uVar3 = situation->bit_col[uVar13];
      lVar17 = 0;
      bVar5 = true;
      do {
        bVar10 = bVar5;
        bVar2 = *(byte *)(lVar17 + (long)(int)(uVar15 - 3) * 0x2000 + 0x311d52 + (ulong)uVar3 * 8);
        if (uVar15 != bVar2) {
          uVar18 = (uint)bVar2 << 4 | uVar13;
          bVar2 = situation->current_board[uVar18];
          if (uVar4 != (bVar2 != 0 && (bVar2 & 0x10) == 0)) {
            all_movements[iVar8].capture = bVar2;
            all_movements[iVar8].from = bVar1;
            all_movements[iVar8].movec = '\0';
            all_movements[iVar8].to = (UINT8)uVar18;
            iVar8 = iVar8 + 1;
            *num_of_all_movements = iVar8;
          }
        }
        lVar17 = 1;
        bVar5 = false;
      } while (bVar10);
    }
    bVar5 = (long)uVar9 < (long)(iVar7 + 0x18);
    uVar9 = uVar9 + 1;
  } while (bVar5);
  uVar9 = uVar16 | 9;
  do {
    bVar1 = situation->current_pieces[uVar9];
    if (bVar1 != 0) {
      uVar13 = bVar1 & 0xf;
      uVar15 = (uint)(bVar1 >> 4);
      uVar3 = situation->bit_row[uVar15];
      lVar17 = 0;
      bVar5 = true;
      do {
        bVar10 = bVar5;
        bVar2 = *(byte *)(lVar17 + ((ulong)uVar13 - 3) * 0x1000 + 0x308d54 + (ulong)uVar3 * 8);
        if (uVar13 != bVar2) {
          uVar14 = (ulong)bVar2 | (ulong)(bVar1 & 0xfffffff0);
          bVar2 = situation->current_board[uVar14];
          if (uVar4 != (bVar2 != 0 && (bVar2 & 0x10) == 0)) {
            all_movements[iVar8].capture = bVar2;
            all_movements[iVar8].from = bVar1;
            all_movements[iVar8].to = (UINT8)uVar14;
            all_movements[iVar8].catc = '\0';
            all_movements[iVar8].movec = '\0';
            iVar8 = iVar8 + 1;
            *num_of_all_movements = iVar8;
          }
        }
        lVar17 = 1;
        bVar5 = false;
      } while (bVar10);
      uVar3 = situation->bit_col[uVar13];
      lVar17 = 0;
      bVar5 = true;
      do {
        bVar10 = bVar5;
        bVar2 = *(byte *)(lVar17 + (long)(int)(uVar15 - 3) * 0x2000 + 0x311d54 + (ulong)uVar3 * 8);
        if (uVar15 != bVar2) {
          uVar18 = (uint)bVar2 << 4 | uVar13;
          bVar2 = situation->current_board[uVar18];
          if (uVar4 != (bVar2 != 0 && (bVar2 & 0x10) == 0)) {
            all_movements[iVar8].capture = bVar2;
            all_movements[iVar8].from = bVar1;
            all_movements[iVar8].to = (UINT8)uVar18;
            all_movements[iVar8].catc = '\0';
            all_movements[iVar8].movec = '\0';
            iVar8 = iVar8 + 1;
            *num_of_all_movements = iVar8;
          }
        }
        lVar17 = 1;
        bVar5 = false;
      } while (bVar10);
    }
    bVar5 = (long)uVar9 < (long)(iVar7 + 0x1a);
    uVar9 = uVar9 + 1;
  } while (bVar5);
  uVar16 = uVar16 | 0xb;
  do {
    bVar1 = situation->current_pieces[uVar16];
    if (bVar1 != 0) {
      iVar12 = *(int *)((long)PAWN_CAN_GET[0][lVar6] + (ulong)((uint)bVar1 * 0x50));
      if (iVar12 != 0) {
        piVar11 = (int *)((ulong)((uint)bVar1 * 0x50) + lVar6 * 0x28 + 0x2f9d54);
        do {
          bVar2 = situation->current_board[iVar12];
          if ((bVar2 != 0) && (uVar4 != ((bVar2 & 0x10) == 0))) {
            all_movements[iVar8].capture = bVar2;
            all_movements[iVar8].from = bVar1;
            all_movements[iVar8].to = (UINT8)iVar12;
            all_movements[iVar8].catc = '\0';
            all_movements[iVar8].movec = '\0';
            iVar8 = iVar8 + 1;
            *num_of_all_movements = iVar8;
          }
          iVar12 = *piVar11;
          piVar11 = piVar11 + 1;
        } while (iVar12 != 0);
      }
    }
    bVar5 = (long)uVar16 < (long)(iVar7 + 0x1f);
    uVar16 = uVar16 + 1;
  } while (bVar5);
  return;
}

Assistant:

void GetAllCaptureMovements(const Situation & situation, int & num_of_all_movements, Movement* all_movements){
    // 1. 获得玩家特征值 
    int player_flag = GetPlayerFlag(situation.current_player), player = situation.current_player;
    int piece_from, piece_to, can_move_counter, piece_to_id;
    // 2. 将(帅)的吃子着法
    for(int i = player_flag + 0; i <= player_flag + 0; i ++){
        if(situation.current_pieces[i] != 0){
            piece_from = situation.current_pieces[i];
            can_move_counter = 0;
            piece_to = KING_CAN_GET[piece_from][player][can_move_counter];
            while(piece_to != 0){
                piece_to_id = situation.current_board[piece_to];
                if(piece_to_id != 0 && ColorOfPiece(piece_to_id) != player){
                    all_movements[num_of_all_movements].capture = piece_to_id;
                    all_movements[num_of_all_movements].from = piece_from;
                    all_movements[num_of_all_movements].to = piece_to;
                    all_movements[num_of_all_movements].catc = 0;
                    all_movements[num_of_all_movements].movec = 0;
                    num_of_all_movements ++;
                }
                can_move_counter ++;
                piece_to = KING_CAN_GET[piece_from][player][can_move_counter];
            }
        }
    }

    // 3. 士(仕)的吃子着法
    for(int i = player_flag + 1; i <= player_flag + 2; i ++){
        if(situation.current_pieces[i] != 0){
            piece_from = situation.current_pieces[i];
            can_move_counter = 0;
            piece_to = ADVISOR_CAN_GET[piece_from][player][can_move_counter];
            while(piece_to != 0){
                piece_to_id = situation.current_board[piece_to];
                if(piece_to_id != 0 && ColorOfPiece(piece_to_id) != player){
                    all_movements[num_of_all_movements].capture = piece_to_id;
                    all_movements[num_of_all_movements].from = piece_from;
                    all_movements[num_of_all_movements].to = piece_to;
                    all_movements[num_of_all_movements].catc = 0;
                    all_movements[num_of_all_movements].movec = 0;
                    num_of_all_movements ++;
                }
                can_move_counter ++;
                piece_to = ADVISOR_CAN_GET[piece_from][player][can_move_counter];
            }
        }
    }
    // 4. 象(相)的吃子着法
    for(int i = player_flag + 3; i <= player_flag + 4; i ++){
        if(situation.current_pieces[i] != 0){
            int bishop_eye;                  // 象眼位置
            piece_from = situation.current_pieces[i];
            can_move_counter = 0;
            piece_to = BISHOP_CAN_GET[piece_from][player][can_move_counter];
            while(piece_to != 0){
                bishop_eye = BISHOP_EYE[piece_from][player][can_move_counter];
                piece_to_id = situation.current_board[piece_to];
                if(piece_to_id != 0 && ColorOfPiece(piece_to_id) != player && situation.current_board[bishop_eye] == 0){
                    all_movements[num_of_all_movements].capture = piece_to_id;
                    all_movements[num_of_all_movements].from = piece_from;
                    all_movements[num_of_all_movements].to = piece_to;
                    all_movements[num_of_all_movements].catc = 0;
                    all_movements[num_of_all_movements].movec = 0;
                    num_of_all_movements ++;
                }
                can_move_counter ++;
                piece_to = BISHOP_CAN_GET[piece_from][player][can_move_counter];
            }
        }
    }

    // 5. 马的吃子着法
    for(int i = player_flag + 5; i <= player_flag + 6; i ++){
        if(situation.current_pieces[i] != 0){
            int horse_leg;                  // 马腿位置
            piece_from = situation.current_pieces[i];
            can_move_counter = 0;
            piece_to = HORSE_CAN_GET[piece_from][can_move_counter];
            while(piece_to != 0){
                horse_leg = HORSE_LEG[piece_from][can_move_counter];
                piece_to_id = situation.current_board[piece_to];
                if(piece_to_id != 0 && ColorOfPiece(piece_to_id) != player && situation.current_board[horse_leg] == 0){
                    all_movements[num_of_all_movements].capture = piece_to_id;
                    all_movements[num_of_all_movements].from = piece_from;
                    all_movements[num_of_all_movements].to = piece_to;
                    all_movements[num_of_all_movements].movec = 0;
                    all_movements[num_of_all_movements].catc = 0;
                    num_of_all_movements ++;
                }
                can_move_counter ++;
                piece_to = HORSE_CAN_GET[piece_from][can_move_counter];
            }
        }
    }

    // 6. 车的吃子着法
    for(int i = player_flag + 7; i <= player_flag + 8; i ++){
        if(situation.current_pieces[i] != 0){
            piece_from = situation.current_pieces[i];
            int col = GetCol(piece_from), row = GetRow(piece_from);

            // 右 左 方向的吃子
            for(int j = 0; j < 2; j ++){
                int capture_col = ROOK_CANNON_CAN_GET_ROW[col - 3][situation.bit_row[row]].rook_capture[j];
                if(capture_col != col){
                    piece_to = GetPosition(capture_col, row);
                    piece_to_id = situation.current_board[piece_to];
                    if(ColorOfPiece(piece_to_id) != player){
                        all_movements[num_of_all_movements].capture = piece_to_id;
                        all_movements[num_of_all_movements].from = piece_from;
                        all_movements[num_of_all_movements].to = piece_to;
                        all_movements[num_of_all_movements].catc = 0;
                        all_movements[num_of_all_movements].movec = 0;
                        num_of_all_movements ++;
                    }
                }
            }
            // 下 上 方向的吃子
            for(int j = 0; j < 2; j ++){
                int capture_row = ROOK_CANNON_CAN_GET_COL[row - 3][situation.bit_col[col]].rook_capture[j];
                if(capture_row != row){
                    piece_to = GetPosition(col, capture_row);
                    piece_to_id = situation.current_board[piece_to];
                    if(ColorOfPiece(piece_to_id) != player){
                        all_movements[num_of_all_movements].capture = piece_to_id;
                        all_movements[num_of_all_movements].from = piece_from;
                        all_movements[num_of_all_movements].movec = 0;
                        all_movements[num_of_all_movements].to = piece_to;
                        num_of_all_movements ++;
                    }
                }
            }
        
        }
    }
    
    // 7. 炮的吃子着法
    for(int i = player_flag + 9; i <= player_flag + 10; i ++){
        if(situation.current_pieces[i] != 0){
            piece_from = situation.current_pieces[i];
            int col = GetCol(piece_from), row = GetRow(piece_from);

            // 右 左 方向的吃子
            for(int j = 0; j < 2; j ++){
                int capture_col = ROOK_CANNON_CAN_GET_ROW[col - 3][situation.bit_row[row]].cannon_capture[j];
                if(capture_col != col){
                    piece_to = GetPosition(capture_col, row);
                    piece_to_id = situation.current_board[piece_to];
                    if(ColorOfPiece(piece_to_id) != player){
                        all_movements[num_of_all_movements].capture = piece_to_id;
                        all_movements[num_of_all_movements].from = piece_from;
                        all_movements[num_of_all_movements].to = piece_to;
                        all_movements[num_of_all_movements].catc = 0;
                        all_movements[num_of_all_movements].movec = 0;
                        num_of_all_movements ++;
                    }
                }
            }
            // 下 上 方向的吃子
            for(int j = 0; j < 2; j ++){
                int capture_row = ROOK_CANNON_CAN_GET_COL[row - 3][situation.bit_col[col]].cannon_capture[j];
                if(capture_row != row){
                    piece_to = GetPosition(col, capture_row);
                    piece_to_id = situation.current_board[piece_to];
                    if(ColorOfPiece(piece_to_id) != player){
                        all_movements[num_of_all_movements].capture = piece_to_id;
                        all_movements[num_of_all_movements].from = piece_from;
                        all_movements[num_of_all_movements].to = piece_to;
                        all_movements[num_of_all_movements].catc = 0;
                        all_movements[num_of_all_movements].movec = 0;
                        num_of_all_movements ++;
                    }
                }
            }
        
        }
    }

    // 8. 兵(卒)的吃子着法
    for(int i = player_flag + 11; i <= player_flag + 15; i ++){
        if(situation.current_pieces[i] != 0){
            piece_from = situation.current_pieces[i];
            can_move_counter = 0;
            piece_to = PAWN_CAN_GET[piece_from][player][can_move_counter];
            while(piece_to != 0){
                piece_to_id = situation.current_board[piece_to];
                if(piece_to_id != 0 && ColorOfPiece(piece_to_id) != player){
                    all_movements[num_of_all_movements].capture = piece_to_id;
                    all_movements[num_of_all_movements].from = piece_from;
                    all_movements[num_of_all_movements].to = piece_to;
                    all_movements[num_of_all_movements].catc = 0;
                    all_movements[num_of_all_movements].movec = 0;
                    num_of_all_movements ++;
                }
                can_move_counter ++;
                piece_to = PAWN_CAN_GET[piece_from][player][can_move_counter];
            }
        }
    }
}